

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

FederateState * __thiscall
helics::CommonCore::getFederateCore(CommonCore *this,GlobalFederateId federateID)

{
  int iVar1;
  FedInfo **ppFVar2;
  long lVar3;
  FedInfo **ppFVar4;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  GlobalFederateId local_24;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_20;
  
  local_24.gid = federateID.gid;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (&local_20,&this->loopFederates,&local_24);
  iVar1 = (this->loopFederates).dataStorage.bsize;
  ppFVar2 = (this->loopFederates).dataStorage.dataptr;
  lVar3 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar2 == (FedInfo **)0x0) {
    ppFVar4 = &gmlc::containers::
               StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
               emptyValue;
  }
  else {
    ppFVar4 = ppFVar2 + lVar3 + 1;
  }
  ppFVar2 = ppFVar2 + lVar3;
  if (iVar1 == 0x20) {
    ppFVar2 = ppFVar4;
    iVar1 = 0;
  }
  if (ppFVar2 == local_20.vec) {
    if (iVar1 != local_20.offset) goto LAB_002afbde;
  }
  else if ((((local_20.vec == (FedInfo **)0x0) || (ppFVar2 == (FedInfo **)0x0)) ||
           (*local_20.vec != (FedInfo *)0x0)) ||
          (iVar1 != local_20.offset || *ppFVar2 != (FedInfo *)0x0)) {
LAB_002afbde:
    return (local_20.ptr)->fed;
  }
  return (FederateState *)0x0;
}

Assistant:

FederateState* CommonCore::getFederateCore(GlobalFederateId federateID)
{
    auto fed = loopFederates.find(federateID);
    return (fed != loopFederates.end()) ? (fed->fed) : nullptr;
}